

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GLsizei GVar5;
  ImDrawList *pIVar6;
  ImDrawCmd *pIVar7;
  code *pcVar8;
  GLvoid *pGVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  GLboolean GVar14;
  GLboolean GVar15;
  int fb_width;
  PFNGLENABLEPROC *pp_Var16;
  int fb_height;
  PFNGLENABLEPROC *pp_Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  GLuint vertex_array_object;
  GLuint last_sampler;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_texture;
  GLuint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint local_98;
  GLuint local_94;
  PFNGLDISABLEPROC *local_90;
  float local_88;
  GLenum local_84;
  GLenum local_80;
  GLenum local_7c;
  GLenum local_78;
  GLenum local_74;
  GLenum local_70;
  GLuint local_6c;
  GLuint local_68;
  GLuint local_64;
  GLuint local_60;
  GLenum local_5c;
  GLint local_58;
  GLint local_54;
  GLsizei local_50;
  GLsizei local_4c;
  GLint local_48;
  GLint local_44;
  GLsizei local_40;
  GLsizei local_3c;
  GLenum local_38 [2];
  
  fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if (0 < fb_height && 0 < fb_width) {
    (*gl3wGetIntegerv)(0x84e0,(GLint *)&local_5c);
    (*gl3wActiveTexture)(0x84c0);
    (*gl3wGetIntegerv)(0x8b8d,(GLint *)&local_60);
    (*gl3wGetIntegerv)(0x8069,(GLint *)&local_64);
    if (g_GlVersion < 0x14a) {
      local_94 = 0;
    }
    else {
      (*gl3wGetIntegerv)(0x8919,(GLint *)&local_94);
    }
    (*gl3wGetIntegerv)(0x8894,(GLint *)&local_68);
    (*gl3wGetIntegerv)(0x85b5,(GLint *)&local_6c);
    (*gl3wGetIntegerv)(0xb40,(GLint *)local_38);
    (*gl3wGetIntegerv)(0xba2,&local_48);
    (*gl3wGetIntegerv)(0xc10,&local_58);
    (*gl3wGetIntegerv)(0x80c9,(GLint *)&local_70);
    (*gl3wGetIntegerv)(0x80c8,(GLint *)&local_74);
    (*gl3wGetIntegerv)(0x80cb,(GLint *)&local_78);
    (*gl3wGetIntegerv)(0x80ca,(GLint *)&local_7c);
    (*gl3wGetIntegerv)(0x8009,(GLint *)&local_80);
    (*gl3wGetIntegerv)(0x883d,(GLint *)&local_84);
    GVar10 = (*gl3wIsEnabled)(0xbe2);
    GVar11 = (*gl3wIsEnabled)(0xb44);
    GVar12 = (*gl3wIsEnabled)(0xb71);
    GVar13 = (*gl3wIsEnabled)(0xb90);
    GVar14 = (*gl3wIsEnabled)(0xc11);
    if ((g_GlVersion < 0x136) || (GVar15 = (*gl3wIsEnabled)(0x8f9d), GVar15 == '\0')) {
      local_90 = &gl3wDisable;
    }
    else {
      local_90 = &gl3wEnable;
    }
    local_98 = 0;
    (*gl3wGenVertexArrays)(1,&local_98);
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_98);
    if (0 < draw_data->CmdListsCount) {
      fVar1 = (draw_data->DisplayPos).x;
      fVar2 = (draw_data->DisplayPos).y;
      local_88 = (float)fb_width;
      fVar3 = (draw_data->FramebufferScale).x;
      fVar4 = (draw_data->FramebufferScale).y;
      lVar19 = 0;
      do {
        pIVar6 = draw_data->CmdLists[lVar19];
        (*gl3wBufferData)(0x8892,(long)(pIVar6->VtxBuffer).Size * 0x14,(pIVar6->VtxBuffer).Data,
                          0x88e0);
        (*gl3wBufferData)(0x8893,(long)(pIVar6->IdxBuffer).Size * 2,(pIVar6->IdxBuffer).Data,0x88e0)
        ;
        if (0 < (pIVar6->CmdBuffer).Size) {
          lVar18 = 0;
          lVar20 = 0;
          do {
            pIVar7 = (pIVar6->CmdBuffer).Data;
            pcVar8 = *(code **)((long)&pIVar7->UserCallback + lVar18);
            if (pcVar8 == (code *)0x0) {
              fVar21 = (*(float *)((long)&(pIVar7->ClipRect).x + lVar18) - fVar1) * fVar3;
              if ((((fVar21 < local_88) &&
                   (fVar22 = (*(float *)((long)&(pIVar7->ClipRect).y + lVar18) - fVar2) * fVar4,
                   fVar22 < (float)fb_height)) &&
                  (fVar23 = (*(float *)((long)&(pIVar7->ClipRect).z + lVar18) - fVar1) * fVar3,
                  0.0 <= fVar23)) &&
                 (fVar24 = (*(float *)((long)&(pIVar7->ClipRect).w + lVar18) - fVar2) * fVar4,
                 0.0 <= fVar24)) {
                (*gl3wScissor)((int)fVar21,(int)((float)fb_height - fVar24),(int)(fVar23 - fVar21),
                               (int)(fVar24 - fVar22));
                (*gl3wBindTexture)(0xde1,*(GLuint *)((long)&pIVar7->TextureId + lVar18));
                GVar5 = *(GLsizei *)((long)&pIVar7->ElemCount + lVar18);
                pGVar9 = (GLvoid *)((ulong)*(uint *)((long)&pIVar7->IdxOffset + lVar18) * 2);
                if (g_GlVersion < 0x140) {
                  (*gl3wDrawElements)(4,GVar5,0x1403,pGVar9);
                }
                else {
                  (*gl3wDrawElementsBaseVertex)
                            (4,GVar5,0x1403,pGVar9,*(GLint *)((long)&pIVar7->VtxOffset + lVar18));
                }
              }
            }
            else if (pcVar8 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_98);
            }
            else {
              (*pcVar8)(pIVar6,(long)&(pIVar7->ClipRect).x + lVar18);
            }
            lVar20 = lVar20 + 1;
            lVar18 = lVar18 + 0x38;
          } while (lVar20 < (pIVar6->CmdBuffer).Size);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < draw_data->CmdListsCount);
    }
    (*gl3wDeleteVertexArrays)(1,&local_98);
    (*gl3wUseProgram)(local_60);
    (*gl3wBindTexture)(0xde1,local_64);
    if (0x149 < g_GlVersion) {
      (*gl3wBindSampler)(0,local_94);
    }
    (*gl3wActiveTexture)(local_5c);
    (*gl3wBindVertexArray)(local_6c);
    (*gl3wBindBuffer)(0x8892,local_68);
    (*gl3wBlendEquationSeparate)(local_80,local_84);
    (*gl3wBlendFuncSeparate)(local_70,local_74,local_78,local_7c);
    pp_Var17 = &gl3wEnable;
    pp_Var16 = &gl3wEnable;
    if (GVar10 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xbe2);
    pp_Var16 = &gl3wEnable;
    if (GVar11 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb44);
    pp_Var16 = &gl3wEnable;
    if (GVar12 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb71);
    pp_Var16 = &gl3wEnable;
    if (GVar13 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb90);
    if (GVar14 == '\0') {
      pp_Var17 = &gl3wDisable;
    }
    (**pp_Var17)(0xc11);
    if (0x135 < g_GlVersion) {
      (**local_90)(0x8f9d);
    }
    (*gl3wPolygonMode)(0x408,local_38[0]);
    (*gl3wViewport)(local_48,local_44,local_40,local_3c);
    (*gl3wScissor)(local_58,local_54,local_50,local_4c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (g_GlVersion >= 330) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (g_GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (g_GlVersion >= 330)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (g_GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}